

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::BufferMapPartialInvalidateCase::iterate
          (BufferMapPartialInvalidateCase *this)

{
  CallLogWrapper *this_00;
  deUint32 seed;
  deUint32 buffer;
  GLenum GVar1;
  int iVar2;
  void *pvVar3;
  TestError *this_01;
  uint uVar4;
  char *description;
  uint uVar5;
  bool bVar6;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  
  seed = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                     );
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            (&verifier,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             this->m_verify);
  bVar6 = this->m_partialWrite == false;
  uVar5 = 0x5b;
  if (bVar6) {
    uVar5 = 0;
  }
  uVar4 = 0x123;
  if (bVar6) {
    uVar4 = 0;
  }
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&refBuf,0x514);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,0x514,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_bufferTarget,0x514,
             refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,this->m_usage);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start + (uVar5 + 200),0x3f3 - uVar5,seed & 0xabcdef);
  pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,this->m_bufferTarget,200,0x3f3,6);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar1,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x134);
  if (pvVar3 != (void *)0x0) {
    memcpy((void *)((long)pvVar3 + (ulong)uVar5),
           refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + (uVar5 + 200),(ulong)(0x3f3 - uVar5));
    glu::CallLogWrapper::glUnmapBuffer(this_00,this->m_bufferTarget);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glUnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                    ,0x139);
    iVar2 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                      (&verifier,(EVP_PKEY_CTX *)(ulong)buffer,
                       refBuf.m_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,(ulong)uVar4,(uchar *)(ulong)(0x514 - uVar4)
                       ,(ulong)this->m_bufferTarget);
    deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
    description = "Buffer verification failed";
    if ((byte)iVar2 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar2 ^ 1),description);
    deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&verifier);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&refBuf);
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x135);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		deUint32		dataSeed		= deStringHash(getName());
		deUint32		buf				= 0;
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier		(m_renderCtx, m_testCtx.getLog(), m_verify);
		const int		bufferSize		= 1300;
		const int		mapOffset		= 200;
		const int		mapSize			= 1011;
		const int		mapWriteOffs	= m_partialWrite ? 91						: 0;
		const int		verifyOffset	= m_partialWrite ? mapOffset+mapWriteOffs	: 0;
		const int		verifySize		= bufferSize-verifyOffset;

		// Setup reference data.
		refBuf.setSize(bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), bufferSize, dataSeed);

		buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, bufferSize, refBuf.getPtr(), m_usage);

		// Do reference map.
		fillWithRandomBytes(refBuf.getPtr(mapOffset+mapWriteOffs), mapSize-mapWriteOffs, dataSeed&0xabcdef);

		void* ptr = glMapBufferRange(m_bufferTarget, mapOffset, mapSize, GL_MAP_WRITE_BIT|GL_MAP_INVALIDATE_RANGE_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		deMemcpy((deUint8*)ptr+mapWriteOffs, refBuf.getPtr(mapOffset+mapWriteOffs), mapSize-mapWriteOffs);
		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		bool isOk = verifier.verify(buf, refBuf.getPtr(), verifyOffset, verifySize, m_bufferTarget);
		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}